

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

Vec_Flt_t * Scl_LibertyReadFloatVec(char *pName)

{
  Vec_Flt_t *p;
  char *__nptr;
  double dVar1;
  
  p = Vec_FltAlloc(100);
  while( true ) {
    __nptr = strtok(pName," \t\n\r\\\",");
    if (__nptr == (char *)0x0) break;
    dVar1 = atof(__nptr);
    Vec_FltPush(p,(float)dVar1);
    pName = (char *)0x0;
  }
  return p;
}

Assistant:

Vec_Flt_t * Scl_LibertyReadFloatVec( char * pName )
{
    char * pToken;
    Vec_Flt_t * vValues = Vec_FltAlloc( 100 );
    for ( pToken = strtok(pName, " \t\n\r\\\","); pToken; pToken = strtok(NULL, " \t\n\r\\\",") )
        Vec_FltPush( vValues, atof(pToken) );
    return vValues;
}